

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_rando_world_edits.hpp
# Opt level: O1

void PatchRandoWorldEdits::replace_sick_merchant_by_chest(World *world)

{
  Map *this;
  pointer ppEVar1;
  mapped_type *ppMVar2;
  Entity *this_00;
  map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
  *this_01;
  key_type local_72;
  Attributes local_70;
  
  local_72 = 0x2ba;
  this_01 = &world->_maps;
  ppMVar2 = std::
            map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
            ::at(this_01,&local_72);
  (*ppMVar2)->_base_chest_id = '\x0e';
  local_72 = 0x2ba;
  ppMVar2 = std::
            map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
            ::at(this_01,&local_72);
  Map::remove_entity(*ppMVar2,'\0',true);
  local_72 = 0x2ba;
  ppMVar2 = std::
            map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
            ::at(this_01,&local_72);
  this = *ppMVar2;
  this_00 = (Entity *)operator_new(0x58);
  local_70.type_id = '\x12';
  local_70.position.x = '\x0e';
  local_70.position.y = '\x12';
  local_70.position.z = '\0';
  local_70.position.half_x = false;
  local_70.position.half_y = false;
  local_70.position.half_z = false;
  local_70.orientation = '\x03';
  local_70.palette = '\x02';
  local_70.behavior_id = 0;
  local_70.speed = '\0';
  local_70.fightable = false;
  local_70.liftable = false;
  local_70.can_pass_through = false;
  local_70.appear_after_player_moved_away = false;
  local_70.gravity_immune = false;
  local_70.talkable = false;
  local_70.dialogue = '\0';
  local_70.entity_to_use_tiles_from = (Entity *)0x0;
  local_70.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_70.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_70.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_70.persistence_flag._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__00261860;
  local_70.persistence_flag.byte = 0xff;
  local_70.persistence_flag.bit = 0xff;
  local_70.flag_unknown_2_3 = false;
  local_70.flag_unknown_2_4 = false;
  local_70.flag_unknown_3_5 = false;
  Entity::Entity(this_00,&local_70);
  Map::add_entity(this,this_00);
  if (local_70.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_70.mask_flags.
                    super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_70.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_70.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  local_72 = 0x2ba;
  ppMVar2 = std::
            map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
            ::at(this_01,&local_72);
  ppEVar1 = ((*ppMVar2)->_entities).super__Vector_base<Entity_*,_std::allocator<Entity_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (((*ppMVar2)->_entities).super__Vector_base<Entity_*,_std::allocator<Entity_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppEVar1) {
    ((*ppEVar1)->_attrs).position.y = '\x15';
    return;
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
}

Assistant:

static void replace_sick_merchant_by_chest(World& world)
    {
        // Set the index for added chest in map to "0E" instead of "C2"
        world.map(MAP_MERCATOR_SPECIAL_SHOP_BACKROOM)->base_chest_id(0x0E);

        // Remove the sick merchant
        world.map(MAP_MERCATOR_SPECIAL_SHOP_BACKROOM)->remove_entity(0);

        // Add a chest
        world.map(MAP_MERCATOR_SPECIAL_SHOP_BACKROOM)->add_entity(new Entity({
                                                                                     .type_id = ENTITY_CHEST,
                                                                                     .position = Position(14, 18, 0),
                                                                                     .orientation = ENTITY_ORIENTATION_NW,
                                                                                     .palette = 2
                                                                             }));

        // Move the kid to hide the fact that the bed looks broken af
        world.map(MAP_MERCATOR_SPECIAL_SHOP_BACKROOM)->entity(0)->position().y = 21;

//   Bed tile GFX swap?
//   rom.set_word(0x0050B4, 0x0008); // Before: 0x2A0C (bit 4 of 102A) | After: 0x0008 (bit 0 of 1000 - always true)
    }